

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelpTest.cpp
# Opt level: O0

void __thiscall Exit_ExitCodes_Test::~Exit_ExitCodes_Test(Exit_ExitCodes_Test *this)

{
  Exit_ExitCodes_Test *this_local;
  
  ~Exit_ExitCodes_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Exit, ExitCodes) {
    CLI::App app;

    auto i = static_cast<int>(CLI::ExitCodes::ExtrasError);
    EXPECT_EQ(0, app.exit(CLI::Success()));
    EXPECT_EQ(0, app.exit(CLI::CallForHelp()));
    EXPECT_EQ(i, app.exit(CLI::ExtrasError({"Thing"})));
    EXPECT_EQ(42, app.exit(CLI::RuntimeError(42)));
    EXPECT_EQ(1, app.exit(CLI::RuntimeError())); // Not sure if a default here is a good thing
}